

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

EdgeControlSpecifierSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EdgeControlSpecifierSyntax,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,
          SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax> *args_1,Token *args_2)

{
  Token closeBracket;
  EdgeControlSpecifierSyntax *pEVar1;
  SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax> *in_RDX;
  EdgeControlSpecifierSyntax *in_RSI;
  undefined8 in_RDI;
  Info *unaff_retaddr;
  Token in_stack_00000008;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pEVar1 = (EdgeControlSpecifierSyntax *)
           allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  closeBracket.info = unaff_retaddr;
  closeBracket.kind = (short)in_RDI;
  closeBracket._2_1_ = (char)((ulong)in_RDI >> 0x10);
  closeBracket.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  closeBracket.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::EdgeControlSpecifierSyntax::EdgeControlSpecifierSyntax
            (in_RSI,in_stack_00000008,in_RDX,closeBracket);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }